

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_alphamapblit_quint16
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  ClipLine *pCVar1;
  long lVar2;
  uchar *puVar3;
  QT_FT_Span *pQVar4;
  uint uVar5;
  int iVar6;
  ushort srcColor;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  int i_1;
  ulong uVar12;
  uchar *puVar13;
  long lVar14;
  quint16 *dest;
  
  if ((!useGammaCorrection) && ((short)(color->rgba >> 0x30) == -1)) {
    srcColor = QRgba64::toRgb16(color);
    if (clip == (QClipData *)0x0) {
      uVar9 = rasterBuffer->bytes_per_line;
      dest = (quint16 *)(rasterBuffer->m_buffer + (long)x * 2 + (long)y * uVar9);
      uVar10 = (ulong)(uint)mapWidth;
      if (mapWidth < 1) {
        uVar10 = 0;
      }
      while (0 < mapHeight) {
        mapHeight = mapHeight + -1;
        for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
          alphamapblend_quint16((uint)map[uVar12],dest,(int)uVar12,srcColor);
        }
        dest = dest + (int)(uVar9 >> 1);
        map = map + mapStride;
      }
    }
    else {
      uVar5 = 0;
      if (0 < y) {
        uVar5 = y;
      }
      uVar9 = (ulong)uVar5;
      iVar6 = mapHeight + y;
      if (rasterBuffer->m_height <= mapHeight + y) {
        iVar6 = rasterBuffer->m_height;
      }
      QClipData::initialize(clip);
      puVar13 = map + ((long)(int)((uVar5 - y) * mapStride) - (long)x);
      for (; (long)uVar9 < (long)iVar6; uVar9 = uVar9 + 1) {
        pCVar1 = clip->m_clipLines;
        lVar2 = rasterBuffer->bytes_per_line;
        puVar3 = rasterBuffer->m_buffer;
        for (lVar11 = 0; lVar11 < pCVar1[uVar9].count; lVar11 = lVar11 + 1) {
          pQVar4 = pCVar1[uVar9].spans;
          iVar8 = pQVar4[lVar11].x;
          iVar7 = pQVar4[lVar11].len + iVar8;
          if (mapWidth + x < iVar7) {
            iVar7 = mapWidth + x;
          }
          if (iVar8 <= x) {
            iVar8 = x;
          }
          for (lVar14 = (long)iVar8; lVar14 < iVar7; lVar14 = lVar14 + 1) {
            alphamapblend_quint16
                      ((uint)puVar13[lVar14],(quint16 *)(puVar3 + lVar2 * uVar9),(int)lVar14,
                       srcColor);
          }
        }
        puVar13 = puVar13 + mapStride;
      }
    }
    return;
  }
  qt_alphamapblit_generic
            (rasterBuffer,x,y,color,map,mapWidth,mapHeight,mapStride,clip,useGammaCorrection);
  return;
}

Assistant:

void qt_alphamapblit_quint16(QRasterBuffer *rasterBuffer,
                             int x, int y, const QRgba64 &color,
                             const uchar *map,
                             int mapWidth, int mapHeight, int mapStride,
                             const QClipData *clip, bool useGammaCorrection)
{
    if (useGammaCorrection || !color.isOpaque()) {
        qt_alphamapblit_generic(rasterBuffer, x, y, color, map, mapWidth, mapHeight, mapStride, clip, useGammaCorrection);
        return;
    }

    const quint16 c = color.toRgb16();

    if (!clip) {
        quint16 *dest = reinterpret_cast<quint16*>(rasterBuffer->scanLine(y)) + x;
        const int destStride = rasterBuffer->stride<quint16>();
        while (--mapHeight >= 0) {
            for (int i = 0; i < mapWidth; ++i)
                alphamapblend_quint16(map[i], dest, i, c);
            dest += destStride;
            map += mapStride;
        }
    } else {
        int top = qMax(y, 0);
        int bottom = qMin(y + mapHeight, rasterBuffer->height());
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            quint16 *dest = reinterpret_cast<quint16*>(rasterBuffer->scanLine(yp));

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);

                for (int xp=start; xp<end; ++xp)
                    alphamapblend_quint16(map[xp - x], dest, xp, c);
            } // for (i -> line.count)
            map += mapStride;
        } // for (yp -> bottom)
    }
}